

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MaterialBinding::set_materialBindingCollection
          (MaterialBinding *this,token *tok,token *mat_purpose,Relationship *rel)

{
  string *psVar1;
  mapped_type *this_00;
  mapped_type *m;
  Relationship *rel_local;
  token *mat_purpose_local;
  token *tok_local;
  MaterialBinding *this_local;
  
  psVar1 = Token::str_abi_cxx11_(tok);
  this_00 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
            ::operator[](&this->_materialBindingCollectionMap,psVar1);
  psVar1 = Token::str_abi_cxx11_(mat_purpose);
  ordered_dict<tinyusdz::Relationship>::insert(this_00,psVar1,rel);
  return;
}

Assistant:

void set_materialBindingCollection(const value::token &tok, const value::token &mat_purpose, const Relationship &rel) {

    // NOTE:
    // https://openusd.org/release/wp_usdshade.html#basic-proposal-for-collection-based-assignment
    // says: material:binding:collection defines a namespace of binding relationships to be applied in namespace order, with the earliest ordered binding relationship the strongest
    //
    // so the app is better first check if `tok` element alreasy exists(using has_materialBindingCollection)

    auto &m = _materialBindingCollectionMap[tok.str()];

    m.insert(mat_purpose.str(), rel);
  }